

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib597.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  int local_324;
  CURLMcode ec_12;
  int ec_11;
  int itimeout;
  CURLMcode ec_10;
  CURLMcode ec_9;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_20c;
  CURLMcode ec_8;
  int maxfd;
  long timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval interval;
  CURLMcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_48;
  CURLMsg *msg;
  int phase;
  int msgs_left;
  int running;
  int res;
  CURLM *multi;
  CURL *easy;
  char *URL_local;
  
  multi = (CURLM *)0x0;
  _running = 0;
  msgs_left = 0;
  easy = (CURL *)URL;
  tVar7 = tutil_tvnow();
  _ec_1 = tVar7.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_48 = tVar7.tv_usec;
  tv_test_start.tv_usec = local_48;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                  ,0x3d,iVar2,uVar3);
    msgs_left = iVar2;
  }
  if (msgs_left == 0) {
    multi = (CURLM *)curl_easy_init();
    if (multi == (CURLM *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                    ,0x3f);
      msgs_left = 0x7c;
    }
    if (msgs_left == 0) {
      _running = curl_multi_init();
      if (_running == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                      ,0x41);
        msgs_left = 0x7b;
      }
      if (msgs_left == 0) {
        for (msg._0_4_ = 0; (int)msg < 2; msg._0_4_ = (int)msg + 1) {
          iVar2 = curl_easy_setopt(multi,0x29,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                          ,0x45,iVar2,uVar3);
            msgs_left = iVar2;
          }
          if (msgs_left != 0) break;
          iVar2 = curl_easy_setopt(multi,0x2712,easy);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                          ,0x48,iVar2,uVar3);
            msgs_left = iVar2;
          }
          if (msgs_left != 0) break;
          if ((int)msg == 0) {
            iVar2 = curl_easy_setopt(multi,0x8d,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x4c,iVar2,uVar3);
              msgs_left = iVar2;
            }
            if (msgs_left != 0) break;
          }
          if ((int)msg == 1) {
            iVar2 = curl_easy_setopt(multi,0x8d,0);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x50,iVar2,uVar3);
              msgs_left = iVar2;
            }
            if (msgs_left != 0) break;
            iVar2 = curl_easy_setopt(multi,0x2c,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x51,iVar2,uVar3);
              msgs_left = iVar2;
            }
            if (msgs_left != 0) break;
            iVar2 = curl_easy_setopt(multi,0x4b,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x52,iVar2,uVar3);
              msgs_left = iVar2;
            }
            if (msgs_left != 0) break;
          }
          iVar2 = curl_multi_add_handle(_running,multi);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                          ,0x55,iVar2,uVar3);
            msgs_left = iVar2;
          }
          while( true ) {
            if (msgs_left != 0) goto LAB_00102e09;
            _ec_8 = -99;
            local_20c = -99;
            iVar2 = curl_multi_perform(_running,&phase);
            uVar1 = _stderr;
            if (iVar2 == 0) {
              if (phase < 0) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                              ,0x5f,phase);
                msgs_left = 0x7a;
              }
            }
            else {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x5f,iVar2,uVar3);
              msgs_left = iVar2;
            }
            if (msgs_left != 0) goto LAB_00102e09;
            tVar7 = tutil_tvnow();
            older.tv_usec = tv_test_start.tv_usec;
            older.tv_sec = tv_test_start.tv_sec;
            lVar4 = tutil_tvdiff(tVar7,older);
            if (5000 < lVar4) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x61);
              msgs_left = 0x7d;
            }
            if (msgs_left != 0) goto LAB_00102e09;
            if (phase == 0) break;
            for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
              fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
            }
            for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
              fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
            }
            for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
              fdexcep.__fds_bits[(ulong)__arr_2._4_4_ - 1] = 0;
            }
            iVar2 = curl_multi_fdset(_running,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,
                                     &timeout,&local_20c);
            uVar1 = _stderr;
            if (iVar2 == 0) {
              if (local_20c < -1) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                              ,0x6a,local_20c);
                msgs_left = 0x7a;
              }
            }
            else {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x6a,iVar2,uVar3);
              msgs_left = iVar2;
            }
            if (msgs_left != 0) goto LAB_00102e09;
            iVar2 = curl_multi_timeout(_running,&ec_8);
            uVar1 = _stderr;
            if (iVar2 == 0) {
              if (_ec_8 < -1) {
                curl_mfprintf(_stderr,
                              "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                              ,0x6e,_ec_8);
                msgs_left = 0x73;
              }
            }
            else {
              uVar3 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x6e,iVar2,uVar3);
              msgs_left = iVar2;
            }
            if (msgs_left != 0) goto LAB_00102e09;
            if (_ec_8 == -1) {
              fdread.__fds_bits[0xf] = 6;
            }
            else {
              if (_ec_8 < 0x80000000) {
                local_324 = (int)_ec_8;
              }
              else {
                local_324 = 0x7fffffff;
              }
              fdread.__fds_bits[0xf] = (__fd_mask)(local_324 / 1000);
            }
            iVar2 = select_wrapper(local_20c + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                   (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&timeout,
                                   (timeval *)(fdread.__fds_bits + 0xf));
            if (iVar2 == -1) {
              piVar5 = __errno_location();
              uVar1 = _stderr;
              iVar2 = *piVar5;
              pcVar6 = strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x7d,iVar2,pcVar6);
              msgs_left = 0x79;
            }
            if (msgs_left != 0) goto LAB_00102e09;
            tVar7 = tutil_tvnow();
            older_00.tv_usec = tv_test_start.tv_usec;
            older_00.tv_sec = tv_test_start.tv_sec;
            lVar4 = tutil_tvdiff(tVar7,older_00);
            if (5000 < lVar4) {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                            ,0x7f);
              msgs_left = 0x7d;
            }
          }
          lVar4 = curl_multi_info_read(_running,(long)&msg + 4);
          if (lVar4 != 0) {
            msgs_left = *(int *)(lVar4 + 0x10);
          }
          iVar2 = curl_multi_remove_handle(_running,multi);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_remove_handle() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib597.c"
                          ,0x86,iVar2,uVar3);
            msgs_left = iVar2;
          }
          if (msgs_left != 0) break;
        }
      }
    }
LAB_00102e09:
    curl_multi_cleanup(_running);
    curl_easy_cleanup(multi);
    curl_global_cleanup();
    URL_local._4_4_ = msgs_left;
  }
  else {
    URL_local._4_4_ = msgs_left;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  int phase;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(easy);

  multi_init(multi);

  for(phase = CONNECT_ONLY_PHASE; phase < LAST_PHASE; ++phase) {
    /* go verbose */
    easy_setopt(easy, CURLOPT_VERBOSE, 1L);

    /* specify target */
    easy_setopt(easy, CURLOPT_URL, URL);

    /* enable 'CONNECT_ONLY' option when in connect phase */
    if(phase == CONNECT_ONLY_PHASE)
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 1L);

    /* enable 'NOBODY' option to send 'QUIT' command in quit phase */
    if(phase == QUIT_PHASE) {
      easy_setopt(easy, CURLOPT_CONNECT_ONLY, 0L);
      easy_setopt(easy, CURLOPT_NOBODY, 1L);
      easy_setopt(easy, CURLOPT_FORBID_REUSE, 1L);
    }

    multi_add_handle(multi, easy);

    for(;;) {
      struct timeval interval;
      fd_set fdread;
      fd_set fdwrite;
      fd_set fdexcep;
      long timeout = -99;
      int maxfd = -99;

      multi_perform(multi, &running);

      abort_on_test_timeout();

      if(!running)
        break; /* done */

      FD_ZERO(&fdread);
      FD_ZERO(&fdwrite);
      FD_ZERO(&fdexcep);

      multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

      /* At this point, maxfd is guaranteed to be greater or equal than -1. */

      multi_timeout(multi, &timeout);

      /* At this point, timeout is guaranteed to be greater or equal than
         -1. */

      if(timeout != -1L) {
        int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
        interval.tv_sec = itimeout/1000;
        interval.tv_usec = (itimeout%1000)*1000;
      }
      else {
        interval.tv_sec = TEST_HANG_TIMEOUT/1000 + 1;
        interval.tv_usec = 0;
      }

      select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

      abort_on_test_timeout();
    }

    msg = curl_multi_info_read(multi, &msgs_left);
    if(msg)
      res = msg->data.result;

    multi_remove_handle(multi, easy);
  }

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}